

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.h
# Opt level: O3

void __thiscall FIX::FileStoreFactory::~FileStoreFactory(FileStoreFactory *this)

{
  *(code **)this = FIX::SocketConnection::onTimeout;
  Dictionary::~Dictionary((Dictionary *)(this + 0x58));
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
               *)(this + 0x28));
  if (*(FileStoreFactory **)(this + 8) != this + 0x18) {
    operator_delete(*(FileStoreFactory **)(this + 8),*(long *)(this + 0x18) + 1);
    return;
  }
  return;
}

Assistant:

FileStoreFactory( const SessionSettings& settings )
: m_settings( settings ) {}